

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vector<int,_4> __thiscall
tcu::swizzleRB<int>(tcu *this,Vector<int,_4> *v,ChannelOrder src,ChannelOrder dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  Vector<int,_4> VVar5;
  
  uVar4 = CONCAT44(in_register_00000014,src);
  if (src == dst) {
    Vector<int,_4>::Vector((Vector<int,_4> *)this,v);
    uVar4 = extraout_RDX;
  }
  else {
    iVar1 = v->m_data[0];
    iVar2 = v->m_data[1];
    iVar3 = v->m_data[3];
    *(int *)this = v->m_data[2];
    *(int *)(this + 4) = iVar2;
    *(int *)(this + 8) = iVar1;
    *(int *)(this + 0xc) = iVar3;
  }
  VVar5.m_data[2] = (int)uVar4;
  VVar5.m_data[3] = (int)((ulong)uVar4 >> 0x20);
  VVar5.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar5.m_data;
}

Assistant:

Vector<T, 4> swizzleRB (const Vector<T, 4>& v, TextureFormat::ChannelOrder src, TextureFormat::ChannelOrder dst)
{
	if (src == dst)
		return v;
	else
	{
		DE_ASSERT((src == TextureFormat::RGB && dst == TextureFormat::BGR) ||
				  (src == TextureFormat::BGR && dst == TextureFormat::RGB) ||
				  (src == TextureFormat::RGBA && dst == TextureFormat::BGRA) ||
				  (src == TextureFormat::BGRA && dst == TextureFormat::RGBA));
		return v.swizzle(2,1,0,3);
	}
}